

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
PutInt<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *pcVar1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar2;
  reentrant_put_transaction<int>_conflict transaction;
  int local_6c;
  reentrant_put_transaction<int> local_68;
  reentrant_put_transaction<int> local_48;
  
  local_6c = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_48,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)i_queue,&local_6c);
  phVar2 = local_48.m_put_transaction.m_queue;
  pcVar1 = local_48.m_queue;
  local_68.m_queue = local_48.m_queue;
  local_68.m_put_transaction.m_queue = local_48.m_put_transaction.m_queue;
  local_68.m_put_transaction.m_put_data.m_control_block =
       local_48.m_put_transaction.m_put_data.m_control_block;
  local_68.m_put_transaction.m_put_data.m_user_storage =
       local_48.m_put_transaction.m_put_data.m_user_storage;
  local_48.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_48.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_48);
  exception_checkpoint();
  __return_storage_ptr__->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)pcVar1;
  (__return_storage_ptr__->m_put_transaction).m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       phVar2;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       local_68.m_put_transaction.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
       local_68.m_put_transaction.m_put_data.m_user_storage;
  local_68.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_68.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_68);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(1);
                exception_checkpoint();
                return std::move(transaction);
            }